

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

format_arg * __thiscall
fmt::v9::detail::specs_handler<char>::get_arg
          (format_arg *__return_storage_ptr__,specs_handler<char> *this,undefined8 param_3,
          int param_4)

{
  buffer_context<char> *this_00;
  uint uVar1;
  
  this_00 = this->context_;
  uVar1 = basic_format_parse_context<char,_fmt::v9::detail::error_handler>::next_arg_id
                    (this->parse_context_);
  get_arg<fmt::v9::basic_format_context<fmt::v9::appender,char>,int>
            (__return_storage_ptr__,(detail *)this_00,
             (basic_format_context<fmt::v9::appender,_char> *)(ulong)uVar1,param_4);
  return __return_storage_ptr__;
}

Assistant:

FMT_CONSTEXPR auto get_arg(auto_id) -> format_arg {
    return detail::get_arg(context_, parse_context_.next_arg_id());
  }